

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_error.hpp
# Opt level: O3

string * __thiscall
jsoncons::json_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,json_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Unexpected end of file";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Source error";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "JSON syntax_error";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Unexpected non-whitespace character after JSON text";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Data item nesting exceeds limit in options";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "JSON strings cannot be quoted with single quotes";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Illegal character in string";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Extra comma";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Expected object member key";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Expected value";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Invalid value";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Expected name separator \':\'";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Illegal control character in string";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Illegal escaped character in string";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = 
    "Invalid codepoint, expected another \\u token to begin the second half of a codepoint surrogate pair."
    ;
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Invalid codepoint, expected hexadecimal digit.";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Invalid codepoint, expected four hexadecimal digits.";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "A number cannot have a leading zero";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Invalid number";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "Expected comma or right brace \'}\'";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Expected comma or right bracket \']\'";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "Unexpected right bracket \']\'";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "Unexpected right brace \'}\'";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "Illegal comment";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "Expected continuation byte";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "Over long UTF-8 sequence";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "Illegal codepoint (>= 0xd800 && <= 0xdfff)";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "UTF-16 surrogate values are illegal in UTF-32";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "Expected low surrogate following the high surrogate";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "Illegal unicode character";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown JSON parser error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const final
        {
            switch (static_cast<json_errc>(ev))
            {
                case json_errc::unexpected_eof:
                    return "Unexpected end of file";
                case json_errc::source_error:
                    return "Source error";
                case json_errc::syntax_error:
                    return "JSON syntax_error";
                case json_errc::extra_character:
                    return "Unexpected non-whitespace character after JSON text";
                case json_errc::max_nesting_depth_exceeded:
                    return "Data item nesting exceeds limit in options";
                case json_errc::single_quote:
                    return "JSON strings cannot be quoted with single quotes";
                case json_errc::illegal_character_in_string:
                    return "Illegal character in string";
                case json_errc::extra_comma:
                    return "Extra comma";
                case json_errc::expected_key:
                    return "Expected object member key";
                case json_errc::expected_value:
                    return "Expected value";
                case json_errc::invalid_value:
                    return "Invalid value";
                case json_errc::expected_colon:
                    return "Expected name separator ':'";
                case json_errc::illegal_control_character:
                    return "Illegal control character in string";
                case json_errc::illegal_escaped_character:
                    return "Illegal escaped character in string";
                case json_errc::expected_codepoint_surrogate_pair:
                    return "Invalid codepoint, expected another \\u token to begin the second half of a codepoint surrogate pair.";
                case json_errc::invalid_hex_escape_sequence:
                    return "Invalid codepoint, expected hexadecimal digit.";
                case json_errc::invalid_unicode_escape_sequence:
                    return "Invalid codepoint, expected four hexadecimal digits.";
                case json_errc::leading_zero:
                    return "A number cannot have a leading zero";
                case json_errc::invalid_number:
                    return "Invalid number";
                case json_errc::expected_comma_or_rbrace:
                    return "Expected comma or right brace '}'";
                case json_errc::expected_comma_or_rbracket:
                    return "Expected comma or right bracket ']'";
                case json_errc::unexpected_rbrace:
                    return "Unexpected right brace '}'";
                case json_errc::unexpected_rbracket:
                    return "Unexpected right bracket ']'";
                case json_errc::illegal_comment:
                    return "Illegal comment";
                case json_errc::expected_continuation_byte:
                    return "Expected continuation byte";
                case json_errc::over_long_utf8_sequence:
                    return "Over long UTF-8 sequence";
                case json_errc::illegal_codepoint:
                    return "Illegal codepoint (>= 0xd800 && <= 0xdfff)";
                case json_errc::illegal_surrogate_value:
                    return "UTF-16 surrogate values are illegal in UTF-32";
                case json_errc::unpaired_high_surrogate:
                    return "Expected low surrogate following the high surrogate";
                case json_errc::illegal_unicode_character:
                    return "Illegal unicode character";
                default:
                    return "Unknown JSON parser error";
                }
        }